

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_block_scalar(yaml_parser_t *parser,int literal)

{
  yaml_token_t *__dest;
  int iVar1;
  undefined1 local_70 [8];
  yaml_token_t token;
  int literal_local;
  yaml_parser_t *parser_local;
  
  token.end_mark.column._4_4_ = literal;
  iVar1 = yaml_parser_remove_simple_key(parser);
  if (iVar1 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    parser->simple_key_allowed = 1;
    iVar1 = yaml_parser_scan_block_scalar
                      (parser,(yaml_token_t *)local_70,token.end_mark.column._4_4_);
    if (iVar1 == 0) {
      parser_local._4_4_ = 0;
    }
    else if (((parser->tokens).tail == (parser->tokens).end) &&
            (iVar1 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                       &(parser->tokens).tail,&(parser->tokens).end), iVar1 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      yaml_token_delete((yaml_token_t *)local_70);
      parser_local._4_4_ = 0;
    }
    else {
      __dest = (parser->tokens).tail;
      (parser->tokens).tail = __dest + 1;
      memcpy(__dest,local_70,0x50);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_block_scalar(yaml_parser_t *parser, int literal)
{
    yaml_token_t token;

    /* Remove any potential simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* A simple key may follow a block scalar. */

    parser->simple_key_allowed = 1;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_block_scalar(parser, &token, literal))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}